

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Vec_Ptr_t * createArenaLi(Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers,Vec_Ptr_t *vArenaSignal)

{
  long lVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Obj_t *pAVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  if (vBarriers != (Vec_Ptr_t *)0x0) {
    uVar2 = vBarriers->nSize;
    if (0 < (long)(int)uVar2) {
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      uVar8 = 8;
      if (8 < uVar2) {
        uVar8 = (ulong)uVar2;
      }
      pVVar3->nSize = 0;
      pVVar3->nCap = (int)uVar8;
      ppvVar4 = (void **)malloc(uVar8 * 8);
      pVVar3->pArray = ppvVar4;
      lVar6 = 0;
      do {
        if (vArenaSignal->nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar5 = Aig_ObjCreateCo(pAigNew,(Aig_Obj_t *)vArenaSignal->pArray[lVar6]);
        iVar7 = (int)uVar8;
        if ((int)lVar6 == iVar7) {
          if (iVar7 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = 0x10;
            uVar8 = 0x10;
          }
          else {
            uVar8 = (ulong)(uint)(iVar7 * 2);
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(uVar8 * 8);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,uVar8 * 8);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = iVar7 * 2;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        lVar1 = lVar6 + 1;
        pVVar3->nSize = (int)lVar1;
        ppvVar4[lVar6] = pAVar5;
        lVar6 = lVar1;
      } while ((int)uVar2 != lVar1);
      return pVVar3;
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * createArenaLi( Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers, Vec_Ptr_t *vArenaSignal )
{
    Vec_Ptr_t *vArenaLi;
    int barrierCount;
    int i;
    Aig_Obj_t *pObj, *pObjDriver;

    if( vBarriers == NULL )
        return NULL;

    barrierCount = Vec_PtrSize(vBarriers);
    if( barrierCount <= 0 )
        return NULL;

    vArenaLi = Vec_PtrAlloc(barrierCount);    
    for( i=0; i<barrierCount; i++ )
    {
        pObjDriver = (Aig_Obj_t *)Vec_PtrEntry( vArenaSignal, i );
        pObj = Aig_ObjCreateCo( pAigNew, pObjDriver );
        Vec_PtrPush( vArenaLi, pObj );
    }

    return vArenaLi;
}